

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O2

bool __thiscall MeCab::Viterbi::analyze(Viterbi *this,Lattice *lattice)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (lattice == (Lattice *)0x0) {
    return false;
  }
  iVar2 = (*lattice->_vptr_Lattice[8])(lattice);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    initPartial(lattice);
    iVar2 = (*lattice->_vptr_Lattice[0x12])(lattice,2);
    if (((char)iVar2 == '\0') &&
       (iVar2 = (*lattice->_vptr_Lattice[0x12])(lattice,8), (char)iVar2 == '\0')) {
      iVar2 = (*lattice->_vptr_Lattice[0x1e])(lattice);
      if ((char)iVar2 == '\0') {
        bVar1 = viterbi<false,false>(this,lattice);
      }
      else {
        bVar1 = viterbi<false,true>(this,lattice);
      }
    }
    else {
      iVar2 = (*lattice->_vptr_Lattice[0x1e])(lattice);
      if ((char)iVar2 == '\0') {
        bVar1 = viterbi<true,false>(this,lattice);
      }
      else {
        bVar1 = viterbi<true,true>(this,lattice);
      }
    }
    if (bVar1 != false) {
      forwardbackward(lattice);
      buildBestLattice(lattice);
      buildAllLattice(lattice);
      initNBest(lattice);
      return true;
    }
  }
  return false;
}

Assistant:

bool Viterbi::analyze(Lattice *lattice) const {
  if (!lattice || !lattice->sentence()) {
    return false;
  }

  if (!initPartial(lattice)) {
    return false;
  }

  bool result = false;
  if (lattice->has_request_type(MECAB_NBEST) ||
      lattice->has_request_type(MECAB_MARGINAL_PROB)) {
    // IsAllPath=true
    if (lattice->has_constraint()) {
      result = viterbi<true, true>(lattice);
    } else {
      result = viterbi<true, false>(lattice);
    }
  } else {
    // IsAllPath=false
    if (lattice->has_constraint()) {
      result = viterbi<false, true>(lattice);
    } else {
      result = viterbi<false, false>(lattice);
    }
    }

  if (!result) {
    return false;
  }

  if (!forwardbackward(lattice)) {
    return false;
  }

  if (!buildBestLattice(lattice)) {
    return false;
  }

  if (!buildAllLattice(lattice)) {
    return false;
  }

  if (!initNBest(lattice)) {
    return false;
  }

  return true;
}